

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O2

void aom_highbd_quantize_b_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i qp [5];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  __m256i local_100;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  init_qp(zbin_ptr,round_ptr,quant_ptr,dequant_ptr,quant_shift_ptr,&local_100,2);
  auVar1 = *(undefined1 (*) [32])coeff_ptr;
  auVar6 = vpabsd_avx2(auVar1);
  auVar8 = vpcmpgtd_avx2(auVar6,(undefined1  [32])local_100);
  if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar8 >> 0x7f,0) == '\0') &&
        (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar8 >> 0xbf,0) == '\0') &&
      (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar8[0x1f]) {
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    local_120 = ZEXT1632(ZEXT816(0));
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    local_130 = (undefined1  [16])0x0;
  }
  else {
    auVar6 = vpaddd_avx2(auVar6,local_e0);
    auVar6 = vpand_avx2(auVar8,auVar6);
    auVar8 = vpmuldq_avx2(auVar6,local_c0);
    auVar9 = vpsrlq_avx2(auVar6,0x20);
    auVar7 = vpsrlq_avx2(local_c0,0x20);
    auVar7 = vpmuldq_avx2(auVar9,auVar7);
    auVar9 = vpsrlq_avx2(auVar8,0x10);
    auVar8 = vpsllq_avx2(auVar7,0x10);
    auVar8 = vpblendd_avx2(auVar9,auVar8,0xaa);
    auVar6 = vpaddd_avx2(auVar6,auVar8);
    auVar8 = vpmuldq_avx2(auVar6,local_80);
    auVar6 = vpsrlq_avx2(auVar6,0x20);
    auVar7 = vpsrlq_avx2(local_80,0x20);
    auVar6 = vpmuldq_avx2(auVar6,auVar7);
    auVar8 = vpsrlq_avx2(auVar8,0xe);
    auVar6 = vpsllq_avx2(auVar6,0x12);
    auVar8 = vpblendd_avx2(auVar8,auVar6,0xaa);
    auVar6 = vpmulld_avx2(auVar8,local_a0);
    auVar7 = vpsrld_avx2(auVar6,2);
    auVar6 = vpcmpgtd_avx2(auVar8,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar8 = vpsignd_avx2(auVar8,auVar1);
    auVar1 = vpsignd_avx2(auVar7,auVar1);
    *(undefined1 (*) [32])qcoeff_ptr = auVar8;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar1;
    auVar1 = vpackssdw_avx2(auVar6,auVar6);
    auVar6 = vpermq_avx2(auVar1,0xd8);
    auVar1 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])iscan),auVar6);
    auVar1 = vpand_avx2(auVar1,auVar6);
    local_120 = vpmaxsw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  }
  update_qp(&local_100);
  auVar6 = vpsrad_avx2(local_c0,0x1f);
  auVar1 = vpshufd_avx2(local_c0,0xf5);
  auVar6 = vpblendd_avx2(auVar1,auVar6,0xaa);
  auVar8 = vpsrad_avx2(local_80,0x1f);
  auVar1 = vpshufd_avx2(local_80,0xf5);
  auVar1 = vpblendd_avx2(auVar1,auVar8,0xaa);
  auVar8 = vpsrlq_avx2(auVar6,0x20);
  do {
    lVar5 = 0;
    while( true ) {
      iscan = (int16_t *)((long)iscan + 0x10);
      if (n_coeffs < 9) {
        auVar2 = vpshufd_avx(local_120._0_16_,0xe);
        auVar2 = vpmaxsw_avx(local_120._0_16_,auVar2);
        auVar3 = vpshuflw_avx(auVar2,0xe);
        auVar2 = vpmaxsw_avx(auVar2,auVar3);
        auVar3 = vpshuflw_avx(auVar2,1);
        auVar2 = vpmaxsw_avx(auVar2,auVar3);
        vpextrw_avx(auVar2,0);
        return;
      }
      auVar7 = *(undefined1 (*) [32])((long)coeff_ptr + lVar5 + 0x20);
      auVar9 = vpabsd_avx2(auVar7);
      auVar12 = vpcmpgtd_avx2(auVar9,(undefined1  [32])local_100);
      auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) + lVar5) = auVar10;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) + lVar5) = auVar10;
      lVar5 = lVar5 + 0x20;
      n_coeffs = n_coeffs + -8;
    }
    auVar9 = vpaddd_avx2(auVar9,local_e0);
    auVar12 = vpand_avx2(auVar12,auVar9);
    auVar11 = vpmuldq_avx2(auVar12,local_c0);
    auVar13 = vpsrad_avx2(auVar12,0x1f);
    auVar4 = vpshufd_avx2(auVar12,0xf5);
    auVar9 = vpmuludq_avx2(auVar4,auVar8);
    auVar13 = vpsrlq_avx2(auVar13,0x20);
    auVar13 = vpmuludq_avx2(auVar13,auVar6);
    auVar9 = vpaddq_avx2(auVar9,auVar13);
    auVar13 = vpsllq_avx2(auVar9,0x20);
    auVar9 = vpmuludq_avx2(auVar4,auVar6);
    auVar9 = vpaddq_avx2(auVar9,auVar13);
    auVar11 = vpsrlq_avx2(auVar11,0x10);
    auVar9 = vpsllq_avx2(auVar9,0x10);
    auVar9 = vpblendd_avx2(auVar11,auVar9,0xaa);
    auVar9 = vpaddd_avx2(auVar12,auVar9);
    auVar12 = vpmuldq_avx2(auVar9,local_80);
    auVar11 = vpsrad_avx2(auVar9,0x1f);
    auVar13 = vpshufd_avx2(auVar9,0xf5);
    auVar9 = vpsrlq_avx2(auVar1,0x20);
    auVar9 = vpmuludq_avx2(auVar13,auVar9);
    auVar11 = vpsrlq_avx2(auVar11,0x20);
    auVar11 = vpmuludq_avx2(auVar11,auVar1);
    auVar9 = vpaddq_avx2(auVar9,auVar11);
    auVar11 = vpsllq_avx2(auVar9,0x20);
    auVar9 = vpmuludq_avx2(auVar13,auVar1);
    auVar9 = vpaddq_avx2(auVar9,auVar11);
    auVar12 = vpsrlq_avx2(auVar12,0xe);
    auVar9 = vpsllq_avx2(auVar9,0x12);
    auVar12 = vpblendd_avx2(auVar12,auVar9,0xaa);
    auVar9 = vpmulld_avx2(local_a0,auVar12);
    auVar11 = vpsrld_avx2(auVar9,2);
    auVar9 = vpcmpgtd_avx2(auVar12,auVar10);
    auVar12 = vpsignd_avx2(auVar12,auVar7);
    auVar7 = vpsignd_avx2(auVar11,auVar7);
    qcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) + lVar5);
    *(undefined1 (*) [32])qcoeff_ptr = auVar12;
    dqcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) + lVar5);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar7;
    auVar7 = vpackssdw_avx2(auVar9,auVar9);
    auVar12._0_16_ = ZEXT116(0) * local_130 + ZEXT116(1) * *(undefined1 (*) [16])iscan;
    auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * local_130;
    auVar9 = vpermq_avx2(auVar7,0xd8);
    auVar7 = vpsubw_avx2(auVar12,auVar9);
    auVar7 = vpand_avx2(auVar7,auVar9);
    local_120 = vpmaxsw_avx2(local_120,auVar7);
    n_coeffs = n_coeffs + -8;
    coeff_ptr = (tran_low_t *)((long)coeff_ptr + lVar5 + 0x20);
  } while( true );
}

Assistant:

void aom_highbd_quantize_b_64x64_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];
  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 2);

  quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 2);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 2);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}